

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

int Lms_ObjAreaUnmark_rec(Gia_Obj_t *pObj)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  while( true ) {
    uVar1 = *(ulong *)pObj;
    if ((((uint)uVar1 >> 0x1e & 1) == 0) || (((uint)uVar1 & 0x9fffffff) == 0x9fffffff)) break;
    *(ulong *)pObj = uVar1 & 0xffffffffbfffffff;
    iVar2 = Lms_ObjAreaUnmark_rec(pObj + -(uVar1 & 0x1fffffff));
    pObj = pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff);
    iVar3 = iVar3 + iVar2 + 1;
  }
  return iVar3;
}

Assistant:

int  Lms_ObjAreaUnmark_rec( Gia_Obj_t * pObj )
{
    if ( !pObj->fMark0 || Gia_ObjIsCi(pObj) )
        return 0;
    pObj->fMark0 = 0;
    return 1 + Lms_ObjAreaUnmark_rec( Gia_ObjFanin0(pObj) ) 
             + Lms_ObjAreaUnmark_rec( Gia_ObjFanin1(pObj) );
}